

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_img_decompress_header(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int numkeys;
  int tstatus;
  int inhdupos;
  int hdupos;
  int bitpix;
  int naxis;
  long naxes [6];
  char card [81];
  int local_d0 [3];
  int local_c4;
  int local_c0;
  int local_bc;
  long local_b8 [6];
  char local_88 [88];
  
  iVar4 = *status;
  if (0 < iVar4) {
    return iVar4;
  }
  if (iVar4 == -1) {
    *status = 0;
  }
  iVar3 = fits_is_compressed_image(infptr,status);
  if (iVar3 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_img_decompress)");
    *status = 0x19e;
    return 0x19e;
  }
  ffghdn(infptr,local_d0 + 2);
  ffghdn(outfptr,&local_c4);
  ffghsp(outfptr,local_d0,(int *)0x0,status);
  local_d0[1] = 0;
  iVar3 = ffgcrd(infptr,"ZSIMPLE",local_88,local_d0 + 1);
  bVar5 = true;
  if ((iVar3 == 0) && (local_c4 == 1)) {
    if (local_d0[0] != 0) {
      ffgipr(outfptr,6,&local_c0,&local_bc,local_b8,status);
      bVar2 = true;
      if (local_bc != 0) goto LAB_001cf050;
      bVar5 = local_d0[2] != 2;
    }
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
LAB_001cf050:
  if (bVar2) {
    local_d0[1] = 0;
    iVar3 = ffgcrd(infptr,"ZTENSION",local_88,local_d0 + 1);
    if ((iVar3 == 0) && (iVar4 != -1)) {
      if (local_d0[0] == 0) {
        iVar3 = 0;
        ffcrim(outfptr,8,0,local_b8,status);
        iVar4 = ffcrhd(outfptr,status);
        if (0 < iVar4) goto LAB_001cf0d5;
      }
      else {
        ffcrhd(outfptr,status);
        iVar3 = 0;
      }
      goto LAB_001cf0d0;
    }
    pFVar1 = infptr->Fptr;
    iVar4 = ffcrim(outfptr,pFVar1->zbitpix,pFVar1->zndim,pFVar1->znaxis,status);
    if (iVar4 < 1) {
      iVar3 = 1;
      goto LAB_001cf0d0;
    }
  }
  else {
    iVar3 = 0;
    iVar4 = local_d0[0];
    if (0 < local_d0[0]) {
      do {
        ffdrec(outfptr,iVar4,status);
        bVar2 = 1 < iVar4;
        iVar4 = iVar4 + -1;
      } while (bVar2);
    }
LAB_001cf0d0:
    if (*status < 1) {
      iVar4 = imcomp_copy_comp2img(infptr,outfptr,iVar3,status);
      if (0 < iVar4) {
        ffpmsg("error copying header keywords from compressed image");
      }
      if (!bVar5) {
        ffmahd(infptr,1,(int *)0x0,status);
        ffrdef(outfptr,status);
        iVar4 = imcomp_copy_prime2img(infptr,outfptr,status);
        if (0 < iVar4) {
          ffpmsg("error copying primary keywords from compressed file");
        }
        ffmahd(infptr,2,(int *)0x0,status);
      }
      goto LAB_001cf0e1;
    }
  }
LAB_001cf0d5:
  ffpmsg("error creating output decompressed image HDU");
LAB_001cf0e1:
  return *status;
}

Assistant:

int fits_img_decompress_header(fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine reads the header of the input tile compressed image and 
  converts it to that of a standard uncompress FITS image.
*/

{
    int writeprime = 0;
    int hdupos, inhdupos, numkeys;
    int nullprime = 0, copyprime = 0, norec = 0, tstatus;
    char card[FLEN_CARD];
    int ii, naxis, bitpix;
    long naxes[MAX_COMPRESS_DIM];

    if (*status > 0)
        return(*status);
    else if (*status == -1) {
        *status = 0;
	writeprime = 1;
    }

    if (!fits_is_compressed_image(infptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_img_decompress)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* get information about the state of the output file; does it already */
    /* contain any keywords and HDUs?  */
    fits_get_hdu_num(infptr, &inhdupos);  /* Get the current output HDU position */
    fits_get_hdu_num(outfptr, &hdupos);  /* Get the current output HDU position */
    fits_get_hdrspace(outfptr, &numkeys, 0, status);

    /* Was the input compressed HDU originally the primary array image? */
    tstatus = 0;
    if (!fits_read_card(infptr, "ZSIMPLE", card, &tstatus)) { 
      /* yes, input HDU was a primary array (not an IMAGE extension) */
      /* Now determine if we can uncompress it into the primary array of */
      /* the output file.  This is only possible if the output file */
      /* currently only contains a null primary array, with no addition */
      /* header keywords and with no following extension in the FITS file. */
      
      if (hdupos == 1) {  /* are we positioned at the primary array? */
            if (numkeys == 0) { /* primary HDU is completely empty */
	        nullprime = 1;
            } else {
                fits_get_img_param(outfptr, MAX_COMPRESS_DIM, &bitpix, &naxis, naxes, status);
	
	        if (naxis == 0) { /* is this a null image? */
                   nullprime = 1;

		   if (inhdupos == 2)  /* must be at the first extension */
		      copyprime = 1;
		}
           }
      }
    } 

    if (nullprime) {  
       /* We will delete the existing keywords in the null primary array
          and uncompress the input image into the primary array of the output.
	  Some of these keywords may be added back to the uncompressed image
	  header later.
       */

       for (ii = numkeys; ii > 0; ii--)
          fits_delete_record(outfptr, ii, status);

    } else  {

       /* if the ZTENSION keyword doesn't exist, then we have to 
          write the required keywords manually */
       tstatus = 0;
       if (fits_read_card(infptr, "ZTENSION", card, &tstatus)) {

          /* create an empty output image with the correct dimensions */
          if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
             (infptr->Fptr)->znaxis, status) > 0)
          {
             ffpmsg("error creating output decompressed image HDU");
    	     return (*status);
          }

	  norec = 1;  /* the required keywords have already been written */

       } else {  /* the input compressed image does have ZTENSION keyword */
       
          if (writeprime) {  /* convert the image extension to a primary array */
	      /* have to write the required keywords manually */

              /* create an empty output image with the correct dimensions */
              if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
                 (infptr->Fptr)->znaxis, status) > 0)
              {
                 ffpmsg("error creating output decompressed image HDU");
    	         return (*status);
              }

	      norec = 1;  /* the required keywords have already been written */

          } else {  /* write the input compressed image to an image extension */

              if (numkeys == 0) {  /* the output file is currently completely empty */
	  
	         /* In this case, the input is a compressed IMAGE extension. */
	         /* Since the uncompressed output file is currently completely empty, */
	         /* we need to write a null primary array before uncompressing the */
                 /* image extension */
	     
                 ffcrim(outfptr, 8, 0, naxes, status); /* naxes is not used */
	     
	         /* now create the empty extension to uncompress into */
                 if (fits_create_hdu(outfptr, status) > 0)
                 {
                      ffpmsg("error creating output decompressed image HDU");
    	              return (*status);
                 }
	  
	      } else {
                  /* just create a new empty extension, then copy all the required */
	          /* keywords into it.  */
                 fits_create_hdu(outfptr, status);
	      }
           }
       }

    }

    if (*status > 0)  {
        ffpmsg("error creating output decompressed image HDU");
    	return (*status);
    }

    /* Copy the table header to the image header. */

    if (imcomp_copy_comp2img(infptr, outfptr, norec, status) > 0)
    {
        ffpmsg("error copying header keywords from compressed image");
    }

    if (copyprime) {  
	/* append any unexpected keywords from the primary array.
	   This includes any keywords except SIMPLE, BITPIX, NAXIS,
	   EXTEND, COMMENT, HISTORY, CHECKSUM, and DATASUM.
	*/

        fits_movabs_hdu(infptr, 1, NULL, status);  /* move to primary array */
	
        /* do this so that any new keywords get written before any blank
	   keywords that may have been appended by imcomp_copy_comp2img  */
        fits_set_hdustruc(outfptr, status);

        if (imcomp_copy_prime2img(infptr, outfptr, status) > 0)
        {
            ffpmsg("error copying primary keywords from compressed file");
        }

        fits_movabs_hdu(infptr, 2, NULL, status); /* move back to where we were */
    }

    return (*status);
}